

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_upkeep(Curl_easy *data)

{
  Curl_easy *data_local;
  
  if ((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (data->multi_easy == (Curl_multi *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = upkeep(&data->multi_easy->conn_cache,data);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode curl_easy_upkeep(struct Curl_easy *data)
{
  /* Verify that we got an easy handle we can work with. */
  if(!GOOD_EASY_HANDLE(data))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi_easy) {
    /* Use the common function to keep connections alive. */
    return upkeep(&data->multi_easy->conn_cache, data);
  }
  else {
    /* No connections, so just return success */
    return CURLE_OK;
  }
}